

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::InternalSwap
          (ItemSimilarityRecommender_SimilarItems *this,
          ItemSimilarityRecommender_SimilarItems *other)

{
  double dVar1;
  int iVar2;
  uint64 uVar3;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->similaritemlist_).super_RepeatedPtrFieldBase,
             &(other->similaritemlist_).super_RepeatedPtrFieldBase);
  uVar3 = this->itemid_;
  this->itemid_ = other->itemid_;
  other->itemid_ = uVar3;
  dVar1 = this->itemscoreadjustment_;
  this->itemscoreadjustment_ = other->itemscoreadjustment_;
  other->itemscoreadjustment_ = dVar1;
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void ItemSimilarityRecommender_SimilarItems::InternalSwap(ItemSimilarityRecommender_SimilarItems* other) {
  similaritemlist_.InternalSwap(&other->similaritemlist_);
  std::swap(itemid_, other->itemid_);
  std::swap(itemscoreadjustment_, other->itemscoreadjustment_);
  std::swap(_cached_size_, other->_cached_size_);
}